

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cpp
# Opt level: O1

VariableLookupPtr __thiscall
Lodtalk::EvaluationScope::lookSymbolRecursively(EvaluationScope *this,Oop symbol)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  VariableLookupPtr VVar3;
  VariableLookupPtr result;
  _func_int **local_30;
  element_type *local_28;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  
  (**(code **)(*(long *)symbol.field_0 + 0x10))(&local_30);
  peVar1 = local_28;
  if ((local_30 == (_func_int **)0x0) &&
     (((anon_union_8_4_0eb573b0_for_Oop_0 *)((long)symbol.field_0 + 8))->pointer != (uint8_t *)0x0))
  {
    VVar3 = lookSymbolRecursively
                      (this,(Oop)((anon_union_8_4_0eb573b0_for_Oop_0 *)((long)symbol.field_0 + 8))->
                                 pointer);
    _Var2 = VVar3.super___shared_ptr<Lodtalk::VariableLookup,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  }
  else {
    this->_vptr_EvaluationScope = local_30;
    (this->parentScope).super___shared_ptr<Lodtalk::EvaluationScope,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)0x0;
    local_28 = (element_type *)0x0;
    (this->parentScope).super___shared_ptr<Lodtalk::EvaluationScope,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = peVar1;
    local_30 = (_func_int **)0x0;
    _Var2._M_pi = extraout_RDX;
  }
  if (local_28 != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_28);
    _Var2._M_pi = extraout_RDX_00;
  }
  VVar3.super___shared_ptr<Lodtalk::VariableLookup,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var2._M_pi;
  VVar3.super___shared_ptr<Lodtalk::VariableLookup,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (VariableLookupPtr)
         VVar3.super___shared_ptr<Lodtalk::VariableLookup,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

VariableLookupPtr EvaluationScope::lookSymbolRecursively(Oop symbol)
{
	auto result = lookSymbol(symbol);
	if(result || !parentScope)
		return result;
	return parentScope->lookSymbolRecursively(symbol);
}